

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

size_t units::findOperatorSep(string *ustring,string *operators)

{
  string *unit;
  char closeSegment;
  char *pcVar1;
  bool bVar2;
  size_t local_50;
  int local_24;
  size_t sStack_20;
  int index;
  size_type sep;
  string *operators_local;
  string *ustring_local;
  
  sep = (size_type)operators;
  operators_local = ustring;
  std::__cxx11::string::append((char *)operators);
  sStack_20 = std::__cxx11::string::find_last_of((string *)operators_local,(ulong)operators);
  while( true ) {
    bVar2 = false;
    if ((sStack_20 != 0xffffffffffffffff) && (bVar2 = false, sStack_20 != 0)) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)operators_local);
      bVar2 = true;
      if (*pcVar1 != ')') {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)operators_local);
        bVar2 = true;
        if (*pcVar1 != '}') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)operators_local);
          bVar2 = *pcVar1 == ']';
        }
      }
    }
    unit = operators_local;
    if (!bVar2) break;
    local_24 = (int)sStack_20 + -1;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)operators_local);
    closeSegment = getMatchCharacter(*pcVar1);
    segmentcheckReverse(unit,closeSegment,&local_24);
    if (local_24 < 1) {
      local_50 = 0xffffffffffffffff;
    }
    else {
      local_50 = std::__cxx11::string::find_last_of((string *)operators_local,(ulong)operators);
    }
    sStack_20 = local_50;
  }
  if (sStack_20 == 0) {
    sStack_20 = 0xffffffffffffffff;
  }
  return sStack_20;
}

Assistant:

static size_t findOperatorSep(const std::string& ustring, std::string operators)
{
    operators.append(")}]");
    auto sep = ustring.find_last_of(operators);

    while (
        sep != std::string::npos && sep > 0 &&
        (ustring[sep] == ')' || ustring[sep] == '}' || ustring[sep] == ']')) {
        int index = static_cast<int>(sep) - 1;
        segmentcheckReverse(ustring, getMatchCharacter(ustring[sep]), index);
        sep = (index > 0) ? ustring.find_last_of(operators, index) :
                            std::string::npos;
    }
    if (sep == 0) {
        // this should not happen
        // LCOV_EXCL_START
        sep = std::string::npos;
        // LCOV_EXCL_STOP
    }
    return sep;
}